

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphanage_tests.cpp
# Opt level: O1

void __thiscall orphanage_tests::too_large_orphan_tx::test_method(too_large_orphan_tx *this)

{
  long lVar1;
  undefined8 uVar2;
  bool bVar3;
  pointer pCVar4;
  iterator in_R8;
  iterator pvVar5;
  iterator in_R9;
  iterator pvVar6;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  check_type cVar7;
  char *local_2e0;
  char *local_2d8;
  undefined1 *local_2d0;
  undefined1 *local_2c8;
  char *local_2c0;
  char *local_2b8;
  undefined1 *local_2b0;
  undefined1 *local_2a8;
  char *local_2a0;
  char *local_298;
  char *local_290;
  char *local_288;
  undefined1 *local_280;
  undefined1 *local_278;
  char *local_270;
  char *local_268;
  undefined4 local_260;
  int local_25c;
  undefined1 local_258 [32];
  undefined1 *local_238;
  undefined1 *local_230;
  char *local_228;
  char *local_220;
  CMutableTransaction tx;
  undefined4 *local_1e0;
  undefined1 local_1d8 [9];
  undefined7 uStack_1cf;
  undefined1 *local_1c8;
  undefined4 **local_1c0;
  int *local_1b8;
  assertion_result local_1b0;
  int **local_198;
  char *local_190;
  char *local_188;
  assertion_result local_180;
  undefined1 local_168 [16];
  undefined1 *local_158;
  vector<CTxOut,_std::allocator<CTxOut>_> local_150 [4];
  TxOrphanage orphanage;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  orphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &orphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_header;
  orphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  orphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  orphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  orphanage.m_peer_work_set._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &orphanage.m_peer_work_set._M_t._M_impl.super__Rb_tree_header._M_header;
  orphanage.m_peer_work_set._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  orphanage.m_peer_work_set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  orphanage.m_peer_work_set._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  orphanage.m_outpoint_to_orphan_it._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &orphanage.m_outpoint_to_orphan_it._M_t._M_impl.super__Rb_tree_header._M_header;
  orphanage.m_outpoint_to_orphan_it._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  orphanage.m_outpoint_to_orphan_it._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  orphanage.m_outpoint_to_orphan_it._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  orphanage.m_orphan_list.
  super__Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  orphanage.m_orphan_list.
  super__Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  orphanage.m_orphan_list.
  super__Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  orphanage.m_next_sweep.__d.__r = (duration)0;
  orphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       orphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  orphanage.m_peer_work_set._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       orphanage.m_peer_work_set._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  orphanage.m_outpoint_to_orphan_it._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       orphanage.m_outpoint_to_orphan_it._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  CMutableTransaction::CMutableTransaction(&tx);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&tx.vin,1);
  BulkTransaction(&tx,0x61a84);
  local_228 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_220 = "";
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x180;
  file.m_begin = (iterator)&local_228;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_238,msg);
  local_258._8_8_ = local_258._8_8_ & 0xffffffffffffff00;
  local_258._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_258._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_258._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  CTransaction::CTransaction((CTransaction *)local_168,&tx);
  local_1d8._0_8_ = (CTransaction *)0x0;
  local_1b0._0_8_ = &::TX_NO_WITNESS;
  local_1b0.m_message.px = (element_type *)local_1d8;
  SerializeTransaction<ParamsStream<SizeComputer&,TransactionSerParams>,CTransaction>
            ((CTransaction *)local_168,
             (ParamsStream<SizeComputer_&,_TransactionSerParams> *)&local_1b0,&::TX_NO_WITNESS);
  uVar2 = local_1d8._0_8_;
  local_1d8._0_8_ = (CTransaction *)0x0;
  local_1b0._0_8_ = &::TX_WITH_WITNESS;
  local_1b0.m_message.px = (element_type *)local_1d8;
  SerializeTransaction<ParamsStream<SizeComputer&,TransactionSerParams>,CTransaction>
            ((CTransaction *)local_168,
             (ParamsStream<SizeComputer_&,_TransactionSerParams> *)&local_1b0,&::TX_WITH_WITNESS);
  local_25c = (int)uVar2 * 3 + local_1d8._0_4_;
  local_1b8 = &local_25c;
  local_1e0 = &local_260;
  local_180.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_25c == 0x61a84);
  local_260 = 0x61a84;
  local_180.m_message.px = (element_type *)0x0;
  local_180.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_190 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_188 = "";
  local_198 = &local_1b8;
  local_1b0.m_message.px = (element_type *)((ulong)local_1b0.m_message.px & 0xffffffffffffff00);
  local_1b0._0_8_ = &PTR__lazy_ostream_013d3e70;
  local_1b0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1c0 = &local_1e0;
  local_1d8[8] = 0;
  local_1d8._0_8_ = &PTR__lazy_ostream_013d3e70;
  local_1c8 = boost::unit_test::lazy_ostream::inst;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_180,(lazy_ostream *)local_258,1,2,REQUIRE,0xee5cf2,(size_t)&local_190,0x180,
             (ParamsStream<SizeComputer_&,_TransactionSerParams> *)&local_1b0,
             "MAX_STANDARD_TX_WEIGHT + 4",(element_type *)local_1d8);
  boost::detail::shared_count::~shared_count(&local_180.m_message.pn);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(local_150);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_168);
  local_270 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_268 = "";
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x181;
  file_00.m_begin = (iterator)&local_270;
  msg_00.m_end = pvVar6;
  msg_00.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_280,
             msg_00);
  local_1d8._0_8_ = (CTransaction *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1d8 + 8),
             (CTransaction **)local_1d8,(allocator<CTransaction> *)local_168,&tx);
  _cVar7 = 0x50ec39;
  bVar3 = TxOrphanage::AddTx(&orphanage,(CTransactionRef *)local_1d8,0);
  local_1b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar3;
  local_1b0.m_message.px = (element_type *)0x0;
  local_1b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_258._0_8_ = "!orphanage.AddTx(MakeTransactionRef(tx), 0)";
  local_258._8_8_ = "";
  local_168[8] = false;
  local_168._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_290 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_288 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_150[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_258;
  boost::test_tools::tt_detail::report_assertion
            (&local_1b0,(lazy_ostream *)local_168,1,0,WARN,_cVar7,(size_t)&local_290,0x181);
  boost::detail::shared_count::~shared_count(&local_1b0.m_message.pn);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(uStack_1cf,local_1d8[8]) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(uStack_1cf,local_1d8[8]));
  }
  pCVar4 = tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    do {
      if (0x1c < (pCVar4->scriptPubKey).super_CScriptBase._size) {
        free((pCVar4->scriptPubKey).super_CScriptBase._union.indirect_contents.indirect);
        (pCVar4->scriptPubKey).super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
      }
      pCVar4 = pCVar4 + 1;
    } while (pCVar4 != tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                       super__Vector_impl_data._M_finish);
    tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
    _M_finish = tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start;
  }
  BulkTransaction(&tx,400000);
  local_2a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_298 = "";
  local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x185;
  file_01.m_begin = (iterator)&local_2a0;
  msg_01.m_end = pvVar6;
  msg_01.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_2b0,
             msg_01);
  local_258._8_8_ = local_258._8_8_ & 0xffffffffffffff00;
  local_258._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_258._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_258._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  CTransaction::CTransaction((CTransaction *)local_168,&tx);
  local_1d8._0_8_ = (CTransaction *)0x0;
  local_1b0._0_8_ = &::TX_NO_WITNESS;
  local_1b0.m_message.px = (element_type *)local_1d8;
  SerializeTransaction<ParamsStream<SizeComputer&,TransactionSerParams>,CTransaction>
            ((CTransaction *)local_168,
             (ParamsStream<SizeComputer_&,_TransactionSerParams> *)&local_1b0,&::TX_NO_WITNESS);
  uVar2 = local_1d8._0_8_;
  local_1d8._0_8_ = (CTransaction *)0x0;
  local_1b0._0_8_ = &::TX_WITH_WITNESS;
  local_1b0.m_message.px = (element_type *)local_1d8;
  SerializeTransaction<ParamsStream<SizeComputer&,TransactionSerParams>,CTransaction>
            ((CTransaction *)local_168,
             (ParamsStream<SizeComputer_&,_TransactionSerParams> *)&local_1b0,&::TX_WITH_WITNESS);
  local_25c = (int)uVar2 * 3 + local_1d8._0_4_;
  local_180.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_25c == 400000);
  local_180.m_message.px = (element_type *)0x0;
  local_180.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_190 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_188 = "";
  local_1b8 = &local_25c;
  local_1b0.m_message.px = (element_type *)((ulong)local_1b0.m_message.px & 0xffffffffffffff00);
  local_1b0._0_8_ = &PTR__lazy_ostream_013d3e70;
  local_1b0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_198 = &local_1b8;
  local_1e0 = &MAX_STANDARD_TX_WEIGHT;
  local_1d8[8] = 0;
  local_1d8._0_8_ = &PTR__lazy_ostream_013d3e70;
  local_1c8 = boost::unit_test::lazy_ostream::inst;
  local_1c0 = &local_1e0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_180,(lazy_ostream *)local_258,1,2,REQUIRE,0xee5cf2,(size_t)&local_190,0x185,
             (ParamsStream<SizeComputer_&,_TransactionSerParams> *)&local_1b0,
             "MAX_STANDARD_TX_WEIGHT",(element_type *)local_1d8);
  boost::detail::shared_count::~shared_count(&local_180.m_message.pn);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(local_150);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_168);
  local_2c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_2b8 = "";
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x186;
  file_02.m_begin = (iterator)&local_2c0;
  msg_02.m_end = pvVar6;
  msg_02.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_2d0,
             msg_02);
  local_1d8._0_8_ = (CTransaction *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1d8 + 8),
             (CTransaction **)local_1d8,(allocator<CTransaction> *)local_168,&tx);
  _cVar7 = 0x50efaf;
  bVar3 = TxOrphanage::AddTx(&orphanage,(CTransactionRef *)local_1d8,0);
  local_1b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)bVar3;
  local_1b0.m_message.px = (element_type *)0x0;
  local_1b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_258._0_8_ = "orphanage.AddTx(MakeTransactionRef(tx), 0)";
  local_258._8_8_ = "";
  local_168[8] = false;
  local_168._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_2e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_2d8 = "";
  local_150[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_258;
  boost::test_tools::tt_detail::report_assertion
            (&local_1b0,(lazy_ostream *)local_168,1,0,WARN,_cVar7,(size_t)&local_2e0,0x186);
  boost::detail::shared_count::~shared_count(&local_1b0.m_message.pn);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(uStack_1cf,local_1d8[8]) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(uStack_1cf,local_1d8[8]));
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&tx.vout);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&tx.vin);
  if (orphanage.m_orphan_list.
      super__Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(orphanage.m_orphan_list.
                    super__Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)orphanage.m_orphan_list.
                          super__Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)orphanage.m_orphan_list.
                          super__Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<COutPoint,_std::pair<const_COutPoint,_std::set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>,_std::_Select1st<std::pair<const_COutPoint,_std::set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_std::set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>_>_>
  ::~_Rb_tree(&orphanage.m_outpoint_to_orphan_it._M_t);
  std::
  _Rb_tree<long,_std::pair<const_long,_std::set<transaction_identifier<true>,_std::less<transaction_identifier<true>_>,_std::allocator<transaction_identifier<true>_>_>_>,_std::_Select1st<std::pair<const_long,_std::set<transaction_identifier<true>,_std::less<transaction_identifier<true>_>,_std::allocator<transaction_identifier<true>_>_>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::set<transaction_identifier<true>,_std::less<transaction_identifier<true>_>,_std::allocator<transaction_identifier<true>_>_>_>_>_>
  ::~_Rb_tree(&orphanage.m_peer_work_set._M_t);
  std::
  _Rb_tree<transaction_identifier<true>,_std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>,_std::_Select1st<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::less<transaction_identifier<true>_>,_std::allocator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>
  ::~_Rb_tree((_Rb_tree<transaction_identifier<true>,_std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>,_std::_Select1st<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::less<transaction_identifier<true>_>,_std::allocator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>
               *)&orphanage);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(too_large_orphan_tx)
{
    TxOrphanage orphanage;
    CMutableTransaction tx;
    tx.vin.resize(1);

    // check that txs larger than MAX_STANDARD_TX_WEIGHT are not added to the orphanage
    BulkTransaction(tx, MAX_STANDARD_TX_WEIGHT + 4);
    BOOST_CHECK_EQUAL(GetTransactionWeight(CTransaction(tx)), MAX_STANDARD_TX_WEIGHT + 4);
    BOOST_CHECK(!orphanage.AddTx(MakeTransactionRef(tx), 0));

    tx.vout.clear();
    BulkTransaction(tx, MAX_STANDARD_TX_WEIGHT);
    BOOST_CHECK_EQUAL(GetTransactionWeight(CTransaction(tx)), MAX_STANDARD_TX_WEIGHT);
    BOOST_CHECK(orphanage.AddTx(MakeTransactionRef(tx), 0));
}